

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_string.h
# Opt level: O0

void __thiscall
agge::annotated_string<char,_agge::style_modifier>::const_iterator::const_iterator
          (const_iterator *this,range *from,const_iterator next_annotation,
          const_iterator annotations_end)

{
  bool bVar1;
  range *from_local;
  const_iterator *this_local;
  const_iterator annotations_end_local;
  const_iterator next_annotation_local;
  
  (this->_current).
  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .begin_index = (from->
                 super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).begin_index;
  (this->_current).
  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .end_index = (from->
               super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).end_index;
  (this->_current).
  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._container = (from->
                super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )._container;
  (this->_current)._annotation = from->_annotation;
  (this->_next_annotation)._M_current = next_annotation._M_current;
  (this->_annotations_end)._M_current = annotations_end._M_current;
  bVar1 = __gnu_cxx::operator!=(&this->_annotations_end,&this->_next_annotation);
  if (bVar1) {
    fetch_annotation(this);
  }
  else {
    range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    set_end((range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this);
  }
  return;
}

Assistant:

inline annotated_string<CharT, AnnotationT>::const_iterator::const_iterator(const range &from,
			typename annotations_t::const_iterator next_annotation,
			typename annotations_t::const_iterator annotations_end)
		: _current(from), _next_annotation(next_annotation), _annotations_end(annotations_end)
	{
		if (_annotations_end != _next_annotation)
			fetch_annotation();
		else
			_current.set_end();
	}